

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O0

string * text_subtitles::findFontArg(string *__return_storage_ptr__,string *text,size_t pos)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  allocator<char> local_39;
  ulong local_38;
  size_t i;
  size_t firstPos;
  size_t sStack_20;
  bool delFound;
  size_t pos_local;
  string *text_local;
  
  firstPos._7_1_ = 0;
  i = 0;
  local_38 = pos;
  sStack_20 = pos;
  pos_local = (size_t)text;
  text_local = __return_storage_ptr__;
  do {
    uVar1 = local_38;
    uVar3 = std::__cxx11::string::size();
    sVar2 = pos_local;
    if (uVar3 <= uVar1) {
      if (i == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_39);
        std::allocator<char>::~allocator(&local_39);
      }
      else {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,sVar2);
      }
      return __return_storage_ptr__;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](pos_local);
    if (*pcVar4 == '=') {
      firstPos._7_1_ = 1;
    }
    else if ((firstPos._7_1_ & 1) != 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[](pos_local);
      if (*pcVar4 == ' ') {
        if (i != 0) {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,pos_local);
          return __return_storage_ptr__;
        }
      }
      else if (i == 0) {
        i = local_38;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

string findFontArg(const string& text, const size_t pos)
{
    bool delFound = false;
    size_t firstPos = 0;
    for (size_t i = pos; i < text.size(); i++)
    {
        if (text[i] == '=')
            delFound = true;
        else if (delFound)
        {
            if (text[i] == ' ')
            {
                if (firstPos != 0)
                    return text.substr(firstPos, i - firstPos);
            }
            else if (firstPos == 0)
                firstPos = i;
        }
    }
    if (firstPos != 0)
        return text.substr(firstPos, text.size() - firstPos);
    return "";
}